

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateServiceDefinitions
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  size_type sVar2;
  reference ppSVar3;
  int local_1c;
  int i;
  Printer *printer_local;
  FileGenerator *this_local;
  
  bVar1 = HasGenericServices(this->file_,&this->options_);
  if (bVar1) {
    for (local_1c = 0;
        sVar2 = std::
                vector<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                ::size(&this->service_generators_), (ulong)(long)local_1c < sVar2;
        local_1c = local_1c + 1) {
      if (0 < local_1c) {
        io::Printer::Print(printer,"\n");
        io::Printer::Print(printer,
                           "// -------------------------------------------------------------------\n"
                          );
        io::Printer::Print(printer,"\n");
      }
      ppSVar3 = std::
                vector<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                ::operator[](&this->service_generators_,(long)local_1c);
      ServiceGenerator::GenerateDeclarations(*ppSVar3,printer);
    }
    io::Printer::Print(printer,"\n");
    io::Printer::Print(printer,
                       "// ===================================================================\n");
    io::Printer::Print(printer,"\n");
  }
  return;
}

Assistant:

void FileGenerator::GenerateServiceDefinitions(io::Printer* printer) {
  if (HasGenericServices(file_, options_)) {
    // Generate service definitions.
    for (int i = 0; i < service_generators_.size(); i++) {
      if (i > 0) {
        printer->Print("\n");
        printer->Print(kThinSeparator);
        printer->Print("\n");
      }
      service_generators_[i]->GenerateDeclarations(printer);
    }

    printer->Print("\n");
    printer->Print(kThickSeparator);
    printer->Print("\n");
  }
}